

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_string_split(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int *piVar1;
  JSShape *sh;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  JSValueUnion p1;
  JSValueUnion JVar5;
  JSValueUnion p2;
  ulong uVar6;
  uint end;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  JSRefCountHeader *p_3;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  JSValue JVar16;
  JSValue JVar17;
  JSValue JVar18;
  JSValue JVar19;
  JSRefCountHeader *p_1;
  uint32_t lim;
  JSValueUnion local_98;
  JSValueUnion local_58;
  int64_t local_50;
  int *local_48;
  ulong local_40;
  
  if (((uint)this_val.tag & 0xfffffffe) == 2) {
    JS_ThrowTypeError(ctx,"cannot convert to object");
  }
  else {
    JVar18 = *argv;
    JVar17 = *argv;
    piVar1 = (int *)argv[1].u.ptr;
    uVar15 = argv[1].tag;
    JVar19 = argv[1];
    uVar13 = (uint)argv->tag;
    if ((uVar13 & 0xfffffffe) != 2) {
      JVar16 = JS_GetPropertyInternal(ctx,*argv,0xcb,*argv,0);
      if (1 < (int)JVar16.tag - 2U) {
        if ((int)JVar16.tag != 6) {
          local_58 = this_val.u;
          local_50 = this_val.tag;
          local_48 = piVar1;
          local_40 = uVar15;
          JVar16 = JS_CallFree(ctx,JVar16,JVar17,2,(JSValue *)&local_58);
          uVar15 = (ulong)JVar16.u.ptr & 0xffffffff00000000;
          goto LAB_00166de8;
        }
        goto LAB_00166de5;
      }
    }
    JVar17 = JS_ToStringInternal(ctx,this_val,0);
    p1 = JVar17.u;
    uVar7 = (uint)JVar17.tag;
    if (uVar7 == 6) {
      JVar18 = (JSValue)(ZEXT816(3) << 0x40);
    }
    else {
      sh = ctx->array_shape;
      (sh->header).ref_count = (sh->header).ref_count + 1;
      JVar16 = JS_NewObjectFromShape(ctx,sh,2);
      JVar5 = JVar16.u;
      if ((uint)JVar16.tag == 6) {
LAB_00166aba:
        JVar18 = (JSValue)(ZEXT816(3) << 0x40);
      }
      else {
        if ((uint)uVar15 == 3) {
          local_58.int32 = 0xffffffff;
        }
        else {
          if (0xfffffff4 < (uint)uVar15) {
            *piVar1 = *piVar1 + 1;
          }
          iVar3 = JS_ToInt32Free(ctx,&local_58.int32,JVar19);
          if (iVar3 < 0) goto LAB_00166aba;
        }
        uVar2 = *(undefined8 *)((long)p1.ptr + 4);
        JVar18 = JS_ToStringInternal(ctx,JVar18,0);
        p2 = JVar18.u;
        uVar15 = (ulong)p2.ptr >> 0x20;
        if ((uint)JVar18.tag != 6) {
          uVar11 = (ulong)local_58.ptr & 0xffffffff;
          if (uVar11 != 0) {
            end = (uint)uVar2 & 0x7fffffff;
            if (uVar13 == 3) {
LAB_00166cba:
              iVar3 = 0;
              uVar10 = 0;
            }
            else {
              uVar6 = (ulong)((uint)*(undefined8 *)((long)p2.ptr + 4) & 0x7fffffff);
              if ((ulong)end == 0) {
                if (uVar6 == 0) goto LAB_00166cfd;
                goto LAB_00166cba;
              }
              uVar12 = (ulong)(uVar6 == 0);
              lVar8 = (end - uVar6) - uVar12;
              if (lVar8 < (long)uVar12) goto LAB_00166cba;
              uVar10 = 0;
              lVar14 = 0;
              uVar9 = uVar12;
              do {
                iVar3 = string_indexof((JSString *)p1.ptr,(JSString *)p2.ptr,(int)uVar9);
                if (iVar3 < 0) break;
                JVar19 = js_sub_string(ctx,(JSString *)p1.ptr,(int)lVar14,iVar3);
                if (((int)JVar19.tag == 6) ||
                   (iVar4 = JS_CreateDataPropertyUint32(ctx,JVar16,uVar10,JVar19,0), iVar4 < 0))
                goto LAB_00166d6b;
                if (uVar11 - 1 == uVar10) goto LAB_00166cfd;
                lVar14 = (long)iVar3 + uVar6;
                uVar9 = uVar12 + lVar14;
                uVar10 = uVar10 + 1;
              } while ((long)uVar9 <= lVar8);
              iVar3 = (int)lVar14;
              uVar10 = uVar10 & 0xffffffff;
            }
            JVar19 = js_sub_string(ctx,(JSString *)p1.ptr,iVar3,end);
            if (((int)JVar19.tag == 6) ||
               (iVar3 = JS_CreateDataPropertyUint32(ctx,JVar16,uVar10,JVar19,0), iVar3 < 0))
            goto LAB_00166d6b;
          }
LAB_00166cfd:
          if ((0xfffffff4 < uVar7) && (iVar3 = *p1.ptr, *(int *)p1.ptr = iVar3 + -1, iVar3 < 2)) {
            __JS_FreeValueRT(ctx->rt,JVar17);
          }
          uVar15 = (ulong)JVar5.ptr & 0xffffffff00000000;
          if ((0xfffffff4 < (uint)JVar18.tag) &&
             (iVar3 = *p2.ptr, *(int *)p2.ptr = iVar3 + -1, iVar3 < 2)) {
            __JS_FreeValueRT(ctx->rt,JVar18);
          }
          goto LAB_00166de8;
        }
      }
LAB_00166d6b:
      if ((0xfffffff4 < (uint)JVar16.tag) &&
         (iVar3 = *JVar5.ptr, *(int *)JVar5.ptr = iVar3 + -1, iVar3 < 2)) {
        __JS_FreeValueRT(ctx->rt,JVar16);
      }
    }
    local_98 = JVar18.u;
    if ((0xfffffff4 < uVar7) && (iVar3 = *p1.ptr, *(int *)p1.ptr = iVar3 + -1, iVar3 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar17);
    }
    if (0xfffffff4 < (uint)JVar18.tag) {
      JVar17.u.ptr = (void *)((ulong)local_98.ptr & 0xffffffff | uVar15 << 0x20);
      iVar3 = *JVar17.u.ptr;
      *(int *)JVar17.u.ptr = iVar3 + -1;
      if (iVar3 < 2) {
        JVar17.tag = JVar18.tag;
        __JS_FreeValueRT(ctx->rt,JVar17);
      }
    }
  }
LAB_00166de5:
  JVar16 = (JSValue)(ZEXT816(6) << 0x40);
  uVar15 = 0;
LAB_00166de8:
  JVar18.tag = JVar16.tag;
  JVar18.u.ptr = (void *)((ulong)JVar16.u.ptr & 0xffffffff | uVar15);
  return JVar18;
}

Assistant:

static JSValue js_string_split(JSContext *ctx, JSValueConst this_val,
                               int argc, JSValueConst *argv)
{
    // split(sep, limit)
    JSValueConst O = this_val, separator = argv[0], limit = argv[1];
    JSValueConst args[2];
    JSValue S, A, R, T;
    uint32_t lim, lengthA;
    int64_t p, q, s, r, e;
    JSString *sp, *rp;

    if (JS_IsUndefined(O) || JS_IsNull(O))
        return JS_ThrowTypeError(ctx, "cannot convert to object");

    S = JS_UNDEFINED;
    A = JS_UNDEFINED;
    R = JS_UNDEFINED;

    if (!JS_IsUndefined(separator) && !JS_IsNull(separator)) {
        JSValue splitter;
        splitter = JS_GetProperty(ctx, separator, JS_ATOM_Symbol_split);
        if (JS_IsException(splitter))
            return JS_EXCEPTION;
        if (!JS_IsUndefined(splitter) && !JS_IsNull(splitter)) {
            args[0] = O;
            args[1] = limit;
            return JS_CallFree(ctx, splitter, separator, 2, args);
        }
    }
    S = JS_ToString(ctx, O);
    if (JS_IsException(S))
        goto exception;
    A = JS_NewArray(ctx);
    if (JS_IsException(A))
        goto exception;
    lengthA = 0;
    if (JS_IsUndefined(limit)) {
        lim = 0xffffffff;
    } else {
        if (JS_ToUint32(ctx, &lim, limit) < 0)
            goto exception;
    }
    sp = JS_VALUE_GET_STRING(S);
    s = sp->len;
    R = JS_ToString(ctx, separator);
    if (JS_IsException(R))
        goto exception;
    rp = JS_VALUE_GET_STRING(R);
    r = rp->len;
    p = 0;
    if (lim == 0)
        goto done;
    if (JS_IsUndefined(separator))
        goto add_tail;
    if (s == 0) {
        if (r != 0)
            goto add_tail;
        goto done;
    }
    q = p;
    for (q = p; (q += !r) <= s - r - !r; q = p = e + r) {
        e = string_indexof(sp, rp, q);
        if (e < 0)
            break;
        T = js_sub_string(ctx, sp, p, e);
        if (JS_IsException(T))
            goto exception;
        if (JS_CreateDataPropertyUint32(ctx, A, lengthA++, T, 0) < 0)
            goto exception;
        if (lengthA == lim)
            goto done;
    }
add_tail:
    T = js_sub_string(ctx, sp, p, s);
    if (JS_IsException(T))
        goto exception;
    if (JS_CreateDataPropertyUint32(ctx, A, lengthA++, T,0 ) < 0)
        goto exception;
done:
    JS_FreeValue(ctx, S);
    JS_FreeValue(ctx, R);
    return A;

exception:
    JS_FreeValue(ctx, A);
    JS_FreeValue(ctx, S);
    JS_FreeValue(ctx, R);
    return JS_EXCEPTION;
}